

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

HighsHashTableEntry<int,_int> *
HighsHashTree<int,_int>::findCommonInLeaf<2>(InnerLeaf<2> *leaf,NodePtr n2,int hashPos)

{
  HighsHashTableEntry<int,_int> *pHVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  HighsHashTableEntry<int,_int> *pHVar6;
  long lVar7;
  ValueType *pVVar8;
  HighsHashTableEntry<int,_int> *pHVar9;
  uint uVar10;
  HighsHashTableEntry<int,_int> *pHVar11;
  int iVar12;
  ulong *puVar13;
  HighsHashTableEntry<int,_int> *pHVar14;
  int iVar15;
  ulong uVar16;
  
  switch((uint)n2.ptrAndType & 7) {
  case 2:
    pHVar9 = HighsHashTree<int,int>::findCommonInLeaf<2,1>
                       (leaf,(InnerLeaf<1> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar9;
  case 3:
    pHVar9 = HighsHashTree<int,int>::findCommonInLeaf<2,2>
                       (leaf,(InnerLeaf<2> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar9;
  case 4:
    pHVar9 = HighsHashTree<int,int>::findCommonInLeaf<2,3>
                       (leaf,(InnerLeaf<3> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar9;
  case 5:
    pHVar9 = HighsHashTree<int,int>::findCommonInLeaf<2,4>
                       (leaf,(InnerLeaf<4> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar9;
  case 6:
    puVar13 = (ulong *)(n2.ptrAndType & 0xfffffffffffffff8);
    pHVar9 = (HighsHashTableEntry<int,_int> *)((leaf->hashes)._M_elems + 1);
    iVar15 = -1;
    pHVar11 = pHVar9;
    uVar3 = (leaf->occupation).occupation & *puVar13;
    do {
      uVar16 = uVar3;
      if (uVar16 == 0) break;
      uVar3 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar10 = (uint)uVar3;
      lVar7 = POPCOUNT((leaf->occupation).occupation >> ((byte)uVar3 & 0x3f));
      iVar4 = (int)lVar7;
      iVar12 = iVar4 + iVar15;
      if (uVar10 != ((uint)(leaf->hashes)._M_elems[iVar12] >> 10 & 0x3f)) {
        pHVar14 = pHVar9 + iVar15 + lVar7;
        do {
          iVar15 = iVar15 + 1;
          piVar5 = &pHVar14->key_;
          pHVar14 = pHVar14 + 1;
        } while (uVar10 != ((uint)*piVar5 >> 10 & 0x3f));
        iVar12 = iVar4 + iVar15;
      }
      uVar2 = *puVar13;
      lVar7 = (long)iVar12;
      pHVar14 = (leaf->entries)._M_elems + lVar7;
      do {
        lVar7 = lVar7 + 1;
        pVVar8 = find_recurse((NodePtr)puVar13[POPCOUNT(uVar2 >> ((byte)uVar3 & 0x3f))],
                              (ulong)(uint)pHVar14->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                              >> 0x20 ^ (ulong)(uint)pHVar14->key_ * -0x75e7c76a1153eaca +
                                        0x1da24fc66dd63e32,hashPos + 1,&pHVar14->key_);
        pHVar6 = pHVar14;
        if ((pVVar8 != (ValueType *)0x0) || (pHVar6 = pHVar11, leaf->size <= lVar7)) break;
        pHVar1 = pHVar14 + -0x16;
        pHVar14 = pHVar14 + 1;
      } while (uVar10 == ((uint)pHVar1->key_ >> 10 & 0x3f));
      pHVar11 = pHVar6;
      uVar3 = uVar16 ^ 1L << (uVar3 & 0x3f);
    } while (pVVar8 == (ValueType *)0x0);
    if (uVar16 != 0) {
      return pHVar11;
    }
  }
  return (HighsHashTableEntry<int,_int> *)0x0;
}

Assistant:

static HighsHashTableEntry<K, V>* findCommonInLeaf(InnerLeaf<SizeClass>* leaf,
                                                     NodePtr n2, int hashPos) {
    switch (n2.getType()) {
      case kInnerLeafSizeClass1:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass1(), hashPos);
      case kInnerLeafSizeClass2:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass2(), hashPos);
      case kInnerLeafSizeClass3:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass3(), hashPos);
      case kInnerLeafSizeClass4:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass4(), hashPos);
      case kBranchNode: {
        BranchNode* branch = n2.getBranchNode();
        uint64_t matchMask = branch->occupation & leaf->occupation;

        int offset = -1;
        while (matchMask) {
          int pos = HighsHashHelpers::log2i(matchMask);
          matchMask ^= (uint64_t{1} << pos);

          int i = leaf->occupation.num_set_until(static_cast<uint8_t>(pos)) +
                  offset;
          while (get_first_chunk16(leaf->hashes[i]) != pos) {
            ++i;
            ++offset;
          }

          int j =
              branch->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;

          do {
            if (find_recurse(branch->child[j],
                             compute_hash(leaf->entries[i].key()), hashPos + 1,
                             leaf->entries[i].key()))
              return &leaf->entries[i];
            ++i;
          } while (i < leaf->size && get_first_chunk16(leaf->hashes[i]) == pos);
        }
        break;
      }
      default:
        break;
    }

    return nullptr;
  }